

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

void Aig_ObjReplace(Aig_Man_t *p,Aig_Obj_t *pObjOld,Aig_Obj_t *pObjNew,int fUpdateLevel)

{
  Aig_Obj_t *pFan1;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  
  if (((ulong)pObjOld & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1d7,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObjOld->field_0x18 & 6) == 2) {
    __assert_fail("!Aig_ObjIsCi(pObjOld) && !Aig_ObjIsCo(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1d9,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  pAVar4 = (Aig_Obj_t *)((ulong)pObjNew & 0xfffffffffffffffe);
  uVar2 = (uint)*(ulong *)&pAVar4->field_0x18;
  if ((ulong)(uVar2 & 7) - 3 < 2) {
    __assert_fail("!Aig_ObjIsBuf(pObjNewR) && !Aig_ObjIsCo(pObjNewR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1db,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  if (pAVar4 != pObjOld) {
    if ((Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe) == pObjOld) {
      __assert_fail("pObjOld != Aig_ObjFanin0(pObjNewR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x1df,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
    }
    if ((Aig_Obj_t *)((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe) != pObjOld) {
      *(ulong *)&pAVar4->field_0x18 =
           *(ulong *)&pAVar4->field_0x18 & 0xffffffff0000003f | (ulong)(uVar2 + 0x40 & 0xffffffc0);
      Aig_ObjDelete_rec(p,pObjOld,0);
      *(ulong *)&pAVar4->field_0x18 =
           *(ulong *)&pAVar4->field_0x18 & 0xffffffff0000003f |
           (ulong)((int)*(ulong *)&pAVar4->field_0x18 - 0x40U & 0xffffffc0);
      p->nObjs[*(uint *)&pObjOld->field_0x18 & 7] = p->nObjs[*(uint *)&pObjOld->field_0x18 & 7] + -1
      ;
      if (((((ulong)pObjNew & 1) == 0) &&
          (uVar2 = (uint)*(undefined8 *)&pObjNew->field_0x18, uVar2 < 0x40)) &&
         (0xfffffffd < (uVar2 & 7) - 7)) {
        pAVar4 = pObjNew->pFanin0;
        pFan1 = pObjNew->pFanin1;
        uVar1 = *(ulong *)&pObjOld->field_0x18;
        *(ulong *)&pObjOld->field_0x18 = uVar1 & 0xfffffffffffffff8 | (ulong)(uVar2 & 7);
        Aig_ObjDisconnect(p,pObjNew);
        Aig_ObjConnect(p,pObjOld,pAVar4,pFan1);
        Aig_ObjDelete(p,pObjNew);
        if (p->pFanData != (int *)0x0) {
          *(ulong *)&pObjOld->field_0x18 =
               *(ulong *)&pObjOld->field_0x18 & 0xff000000ffffffff | uVar1 & 0xffffff00000000;
          Aig_ManUpdateLevel(p,pObjOld);
        }
        if (fUpdateLevel != 0) {
          Aig_ObjClearReverseLevel(p,pObjOld);
          Aig_ManUpdateReverseLevel(p,pObjOld);
        }
      }
      else {
        *(ulong *)&pObjOld->field_0x18 = *(ulong *)&pObjOld->field_0x18 & 0xfffffffffffffff8 | 4;
        Aig_ObjConnect(p,pObjOld,pObjNew,(Aig_Obj_t *)0x0);
        p->nBufReplaces = p->nBufReplaces + 1;
      }
      p->nObjs[*(uint *)&pObjOld->field_0x18 & 7] = p->nObjs[*(uint *)&pObjOld->field_0x18 & 7] + 1;
      if ((p->pFanData != (int *)0x0) && ((*(uint *)&pObjOld->field_0x18 & 7) == 4)) {
        Vec_PtrPush(p->vBufs,pObjOld);
        iVar3 = p->vBufs->nSize;
        if (iVar3 < p->nBufMax) {
          iVar3 = p->nBufMax;
        }
        p->nBufMax = iVar3;
        Aig_ManPropagateBuffers(p,fUpdateLevel);
        return;
      }
      return;
    }
    __assert_fail("pObjOld != Aig_ObjFanin1(pObjNewR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1e0,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
  }
  __assert_fail("pObjOld != pObjNewR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                ,0x1dd,"void Aig_ObjReplace(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
}

Assistant:

void Aig_ObjReplace( Aig_Man_t * p, Aig_Obj_t * pObjOld, Aig_Obj_t * pObjNew, int fUpdateLevel )
{
    Aig_Obj_t * pObjNewR = Aig_Regular(pObjNew);
    // the object to be replaced cannot be complemented
    assert( !Aig_IsComplement(pObjOld) );
    // the object to be replaced cannot be a terminal
    assert( !Aig_ObjIsCi(pObjOld) && !Aig_ObjIsCo(pObjOld) );
    // the object to be used cannot be a buffer or a PO
    assert( !Aig_ObjIsBuf(pObjNewR) && !Aig_ObjIsCo(pObjNewR) );
    // the object cannot be the same
    assert( pObjOld != pObjNewR );
    // make sure object is not pointing to itself
    assert( pObjOld != Aig_ObjFanin0(pObjNewR) );
    assert( pObjOld != Aig_ObjFanin1(pObjNewR) );
    if ( pObjOld == Aig_ObjFanin0(pObjNewR) || pObjOld == Aig_ObjFanin1(pObjNewR) )
    {
        printf( "Aig_ObjReplace(): Internal error!\n" );
        exit(1);
    }
    // recursively delete the old node - but leave the object there
    pObjNewR->nRefs++;
    Aig_ObjDelete_rec( p, pObjOld, 0 );
    pObjNewR->nRefs--;
    // if the new object is complemented or already used, create a buffer
    p->nObjs[pObjOld->Type]--;
    if ( Aig_IsComplement(pObjNew) || Aig_ObjRefs(pObjNew) > 0 || !Aig_ObjIsNode(pObjNew) )
    {
        pObjOld->Type = AIG_OBJ_BUF;
        Aig_ObjConnect( p, pObjOld, pObjNew, NULL );
        p->nBufReplaces++;
    }
    else
    {
        Aig_Obj_t * pFanin0 = pObjNew->pFanin0;
        Aig_Obj_t * pFanin1 = pObjNew->pFanin1;
        int LevelOld = pObjOld->Level;
        pObjOld->Type = pObjNew->Type;
        Aig_ObjDisconnect( p, pObjNew );
        Aig_ObjConnect( p, pObjOld, pFanin0, pFanin1 );
        // delete the new object
        Aig_ObjDelete( p, pObjNew );
        // update levels
        if ( p->pFanData )
        {
            pObjOld->Level = LevelOld;
            Aig_ManUpdateLevel( p, pObjOld );
        }
        if ( fUpdateLevel )
        {
            Aig_ObjClearReverseLevel( p, pObjOld );
            Aig_ManUpdateReverseLevel( p, pObjOld );
        }
    }
    p->nObjs[pObjOld->Type]++;
    // store buffers if fanout is allocated
    if ( p->pFanData && Aig_ObjIsBuf(pObjOld) )
    {
        Vec_PtrPush( p->vBufs, pObjOld );
        p->nBufMax = Abc_MaxInt( p->nBufMax, Vec_PtrSize(p->vBufs) );
        Aig_ManPropagateBuffers( p, fUpdateLevel );
    }
}